

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int extraout_EDX;
  placalc *this;
  placalc *unaff_R12;
  double dVar3;
  sigaction sa;
  allocator local_149;
  float local_148;
  float local_144;
  string local_140;
  undefined1 local_120 [32];
  string local_100;
  string local_e0;
  sigaction local_c0;
  
  progname = *argv;
  local_144 = 1.0;
  local_148 = 0.0;
  while( true ) {
    while (iVar2 = getopt(argc,argv,"f:F:vh"), iVar2 == 0x66) {
      dVar3 = atof(_optarg);
      local_144 = (float)dVar3;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x46) {
      if (iVar2 == 0x76) {
        main_cold_1();
      }
      main_cold_6();
LAB_00103358:
      main_cold_5();
LAB_0010335d:
      main_cold_4();
      if (local_140._M_dataplus._M_p != &optarg) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((placalc *)local_120._0_8_ != unaff_R12) {
        operator_delete((void *)local_120._0_8_);
      }
      if (extraout_EDX == 1) {
        main_cold_3();
      }
      _Unwind_Resume();
    }
    dVar3 = atof(_optarg);
    local_148 = (float)dVar3;
  }
  if ((local_144 < 0.0) || (1.0 < local_144)) goto LAB_00103358;
  if (0.0 <= local_148) {
    if ((local_144 < 1.0) && (0.0 < local_148)) {
      main_cold_2();
      local_144 = 1.0;
    }
    memset(&local_c0,0,0x98);
    sigemptyset(&local_c0.sa_mask);
    local_c0.__sigaction_handler.sa_handler = segfault_sigaction;
    local_c0.sa_flags = 4;
    sigaction(0xb,&local_c0,(sigaction *)0x0);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    initstreams(&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)local_120,progname,&local_149);
    paVar1 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"INFO","");
    logprintf((string *)local_120,&local_140,"starting process...\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    this = (placalc *)local_120._0_8_;
    if ((placalc *)local_120._0_8_ != (placalc *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    placalc::doit(this,local_144,local_148);
    std::__cxx11::string::string((string *)local_120,progname,&local_149);
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"INFO","");
    logprintf((string *)local_120,&local_140,"finishing process...\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((placalc *)local_120._0_8_ != (placalc *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    return 0;
  }
  goto LAB_0010335d;
}

Assistant:

int main(int argc, char *argv[]) {

  int opt;
  float relativeSecondaryFactor = 1.;
  float absoluteFactor = 0.0;
  progname = argv[0];
  while ((opt = getopt(argc, argv, "f:F:vh")) != -1) {
    switch (opt) {
      case 'f':
	relativeSecondaryFactor = atof(optarg);
	break;
      case 'F':
	absoluteFactor = atof(optarg);
	break;
      case 'v':
	fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (relativeSecondaryFactor < 0.0 || relativeSecondaryFactor > 1.0) {
    fprintf(stderr,
	    "FATAL: Relative secondary factor %f must lie within range [0, 1]\n",
	    relativeSecondaryFactor);
    exit(EXIT_FAILURE);
  }
  if (absoluteFactor < 0.0) {
    fprintf(stderr, "FATAL: Absolute factor %f must be positive value\n",
	    absoluteFactor);
    exit(EXIT_FAILURE);
  }
  if (relativeSecondaryFactor < 1.0 && absoluteFactor > 0.0) {
    fprintf(stderr,
	    "WARNING: Relative secondary and absolute factors are incompatible\n"
	    "INFO: Ignoring relative secondary factor\n");
    relativeSecondaryFactor = 1.;
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    initstreams();
    logprintf(progname, "INFO", "starting process...\n");
    placalc::doit(relativeSecondaryFactor, absoluteFactor);
    logprintf(progname, "INFO", "finishing process...\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);
  }

}